

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O2

string * __thiscall
anon_unknown.dwarf_11e143::StringFixture::convert
          (string *__return_storage_ptr__,StringFixture *this,string *source)

{
  string *s;
  string sStack_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&sStack_68,(string *)this);
  pstore::dump::string::string(&local_48,&sStack_68,false);
  (anonymous_namespace)::StringFixture::convert_abi_cxx11_(__return_storage_ptr__,&local_48,s);
  pstore::dump::string::~string(&local_48);
  std::__cxx11::string::~string((string *)&sStack_68);
  return __return_storage_ptr__;
}

Assistant:

std::string StringFixture::convert (std::string const & source) const {
        return this->convert (::pstore::dump::string{source});
    }